

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_example.cc
# Opt level: O2

GameResult SimulateGame(HanabiGame *game,bool verbose,mt19937 *rng)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  result_type rVar4;
  ostream *poVar5;
  int iVar6;
  int i_1;
  int i;
  ulong uVar7;
  long lVar8;
  GameResult GVar9;
  value_type move;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  chance_outcomes;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  legal_moves;
  uniform_int_distribution<unsigned_long> dist;
  HanabiState state;
  
  hanabi_learning_env::HanabiState::HanabiState(&state,game,-1);
  iVar2 = 0;
  iVar6 = 0;
  while( true ) {
    bVar1 = hanabi_learning_env::HanabiState::IsTerminal(&state);
    if (bVar1) break;
    if (state.cur_player_ == -1) {
      hanabi_learning_env::HanabiState::ChanceOutcomes(&chance_outcomes,&state);
      std::discrete_distribution<unsigned_long>::param_type::
      param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((param_type *)&legal_moves,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 chance_outcomes.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 chance_outcomes.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      rVar4 = std::discrete_distribution<unsigned_long>::operator()
                        ((discrete_distribution<unsigned_long> *)&legal_moves,rng);
      move = chance_outcomes.first.
             super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
             ._M_impl.super__Vector_impl_data._M_start[rVar4];
      if (verbose) {
        std::operator<<((ostream *)&std::cout,"Legal chance:");
        for (uVar7 = 0;
            uVar7 < (ulong)((long)chance_outcomes.first.
                                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)chance_outcomes.first.
                                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1
            ) {
          poVar5 = std::operator<<((ostream *)&std::cout," <");
          hanabi_learning_env::HanabiMove::ToString_abi_cxx11_
                    ((string *)&dist,
                     chance_outcomes.first.
                     super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar7);
          poVar5 = std::operator<<(poVar5,(string *)&dist);
          std::operator<<(poVar5,", ");
          poVar5 = std::ostream::_M_insert<double>
                             (chance_outcomes.second.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar7]);
          std::operator<<(poVar5,">");
          std::__cxx11::string::~string((string *)&dist);
        }
        std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<((ostream *)&std::cout,"Sampled move: ");
        hanabi_learning_env::HanabiMove::ToString_abi_cxx11_((string *)&dist,&move);
        poVar5 = std::operator<<(poVar5,(string *)&dist);
        std::operator<<(poVar5,"\n\n");
        std::__cxx11::string::~string((string *)&dist);
      }
      hanabi_learning_env::HanabiState::ApplyMove(&state,move);
      std::discrete_distribution<unsigned_long>::param_type::~param_type((param_type *)&legal_moves)
      ;
      std::
      pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
      ::~pair(&chance_outcomes);
    }
    else {
      hanabi_learning_env::HanabiState::LegalMoves(&legal_moves,&state,state.cur_player_);
      dist._M_param._M_b =
           ((long)legal_moves.
                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)legal_moves.
                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      dist._M_param._M_a = 0;
      rVar4 = std::uniform_int_distribution<unsigned_long>::operator()(&dist,rng);
      move = legal_moves.
             super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
             ._M_impl.super__Vector_impl_data._M_start[rVar4];
      if (verbose) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Current player: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,state.cur_player_);
        std::operator<<(poVar5,"\n");
        hanabi_learning_env::HanabiState::ToString_abi_cxx11_((string *)&chance_outcomes,&state);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)&chance_outcomes);
        std::operator<<(poVar5,"\n\n");
        std::__cxx11::string::~string((string *)&chance_outcomes);
        std::operator<<((ostream *)&std::cout,"Legal moves:");
        lVar8 = 0;
        for (uVar7 = 0;
            uVar7 < (ulong)((long)legal_moves.
                                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)legal_moves.
                                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1
            ) {
          poVar5 = std::operator<<((ostream *)&std::cout," ");
          hanabi_learning_env::HanabiMove::ToString_abi_cxx11_
                    ((string *)&chance_outcomes,
                     (HanabiMove *)
                     ((long)&(legal_moves.
                              super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                              ._M_impl.super__Vector_impl_data._M_start)->move_type_ + lVar8));
          std::operator<<(poVar5,(string *)&chance_outcomes);
          std::__cxx11::string::~string((string *)&chance_outcomes);
          lVar8 = lVar8 + 8;
        }
        std::operator<<((ostream *)&std::cout,"\n");
        poVar5 = std::operator<<((ostream *)&std::cout,"Sampled move: ");
        hanabi_learning_env::HanabiMove::ToString_abi_cxx11_((string *)&chance_outcomes,&move);
        poVar5 = std::operator<<(poVar5,(string *)&chance_outcomes);
        std::operator<<(poVar5,"\n\n");
        std::__cxx11::string::~string((string *)&chance_outcomes);
      }
      hanabi_learning_env::HanabiState::ApplyMove(&state,move);
      iVar2 = iVar2 + 1;
      iVar6 = iVar6 + (uint)state.move_history_.
                            super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].scored;
      std::
      _Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
      ::~_Vector_base((_Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                       *)&legal_moves);
    }
  }
  if (verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Game done, terminal state:\n");
    hanabi_learning_env::HanabiState::ToString_abi_cxx11_((string *)&chance_outcomes,&state);
    poVar5 = std::operator<<(poVar5,(string *)&chance_outcomes);
    std::operator<<(poVar5,"\n\n");
    std::__cxx11::string::~string((string *)&chance_outcomes);
    poVar5 = std::operator<<((ostream *)&std::cout,"score = ");
    iVar3 = hanabi_learning_env::HanabiState::Score(&state);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::operator<<(poVar5,"\n\n");
  }
  GVar9.score = hanabi_learning_env::HanabiState::Score(&state);
  hanabi_learning_env::HanabiState::~HanabiState(&state);
  GVar9.fireworks_played = iVar6;
  GVar9.num_steps = iVar2;
  return GVar9;
}

Assistant:

GameResult SimulateGame(const hanabi_learning_env::HanabiGame& game,
                        bool verbose, std::mt19937* rng) {
  hanabi_learning_env::HanabiState state(&game);
  GameResult result = {0, 0, 0};
  while (!state.IsTerminal()) {
    if (state.CurPlayer() == hanabi_learning_env::kChancePlayerId) {
      // All of this could be replaced with state.ApplyRandomChance().
      // Only done this way to demonstrate picking specific chance moves.
      auto chance_outcomes = state.ChanceOutcomes();
      std::discrete_distribution<std::mt19937::result_type> dist(
          chance_outcomes.second.begin(), chance_outcomes.second.end());
      auto move = chance_outcomes.first[dist(*rng)];
      if (verbose) {
        std::cout << "Legal chance:";
        for (int i = 0; i < chance_outcomes.first.size(); ++i) {
          std::cout << " <" << chance_outcomes.first[i].ToString() << ", "
                    << chance_outcomes.second[i] << ">";
        }
        std::cout << "\n";
        std::cout << "Sampled move: " << move.ToString() << "\n\n";
      }
      state.ApplyMove(move);
      continue;
    }

    auto legal_moves = state.LegalMoves(state.CurPlayer());
    std::uniform_int_distribution<std::mt19937::result_type> dist(
        0, legal_moves.size() - 1);
    auto move = legal_moves[dist(*rng)];
    if (verbose) {
      std::cout << "Current player: " << state.CurPlayer() << "\n";
      std::cout << state.ToString() << "\n\n";
      std::cout << "Legal moves:";
      for (int i = 0; i < legal_moves.size(); ++i) {
        std::cout << " " << legal_moves[i].ToString();
      }
      std::cout << "\n";
      std::cout << "Sampled move: " << move.ToString() << "\n\n";
    }
    state.ApplyMove(move);
    ++result.num_steps;
    if (state.MoveHistory().back().scored) {
      ++result.fireworks_played;
    }
  }

  if (verbose) {
    std::cout << "Game done, terminal state:\n" << state.ToString() << "\n\n";
    std::cout << "score = " << state.Score() << "\n\n";
  }

  result.score = state.Score();
  return result;
}